

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O2

string * __thiscall
Lib::Exception::
toString<char_const*,char_const*,char_const*,std::__cxx11::string,char_const*,unsigned_int>
          (string *__return_storage_ptr__,Exception *this,char *msg,char *msg_1,char *msg_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *msg_3,char *msg_4,
          uint msg_5)

{
  stringstream out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__cxx11::string::string((string *)&local_1d0,(string *)msg_3);
  OutputAll<const_char_*,_const_char_*,_const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_unsigned_int>
  ::apply(local_1a0,msg,msg_1,msg_2,&local_1d0,msg_4,msg_5);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(Msg... msg){
    std::stringstream out;
    OutputAll<Msg...>::apply(out, msg...);
    return out.str();
  }